

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::build_alt_props(CVmObjGramProd *this,vm_obj_id_t match_obj)

{
  vm_obj_id_t obj;
  CVmObject *pCVar1;
  uint in_ESI;
  size_t in_RDI;
  CVmObjList *lst;
  vm_val_t lstval;
  size_t cnt;
  undefined8 in_stack_ffffffffffffffd0;
  int in_root_set;
  vm_val_t local_28;
  size_t local_18;
  uint local_c;
  
  in_root_set = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (G_predef_X.gramprod_alt_props != 0) {
    local_c = in_ESI;
    local_18 = build_alt_props_list
                         ((CVmObjGramProd *)cnt,lstval.val._4_4_,(CVmObjList *)lstval._0_8_);
    obj = CVmObjList::create(in_root_set,in_RDI);
    vm_val_t::set_obj(&local_28,obj);
    vm_objp(0);
    build_alt_props_list((CVmObjGramProd *)cnt,lstval.val._4_4_,(CVmObjList *)lstval._0_8_);
    CVmObjList::cons_uniquify((CVmObjList *)lstval._0_8_);
    pCVar1 = vm_objp(0);
    (*pCVar1->_vptr_CVmObject[0xc])
              (pCVar1,G_undo_X,(ulong)local_c,(ulong)G_predef_X.gramprod_alt_props,&local_28);
  }
  return;
}

Assistant:

void CVmObjGramProd::build_alt_props(VMG_ vm_obj_id_t match_obj)
{
    /* if there's no grammarAltProps property export, skip this */
    if (G_predef->gramprod_alt_props == VM_INVALID_PROP)
        return;

    /* first do a scan without an output list to count the properties */
    size_t cnt = build_alt_props_list(vmg_ match_obj, 0);

    /* create the list */
    vm_val_t lstval;
    lstval.set_obj(CVmObjList::create(vmg_ FALSE, cnt));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lstval.val.obj);

    /* build the list */
    build_alt_props_list(vmg_ match_obj, lst);

    /* keep only unique properties in the list */
    lst->cons_uniquify(vmg0_);

    /* store it in the match object under grammarAltProps */
    vm_objp(vmg_ match_obj)->set_prop(
        vmg_ G_undo, match_obj, G_predef->gramprod_alt_props, &lstval);
}